

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
WrappedArgsParser::WrappedArgsParser(WrappedArgsParser *this,string *pname,group *sel)

{
  group *pgVar1;
  string *in_RSI;
  string *in_RDI;
  parameter *in_stack_fffffffffffff828;
  parameter *docstr;
  parameter *in_stack_fffffffffffff830;
  parameter *this_00;
  group *in_stack_fffffffffffff838;
  group *in_stack_fffffffffffff840;
  group *this_01;
  parameter *this_02;
  parameter *this_03;
  group *in_stack_fffffffffffff970;
  group *in_stack_fffffffffffff978;
  char (*in_stack_fffffffffffff980) [10];
  char (*in_stack_fffffffffffff988) [3];
  parameter *in_stack_fffffffffffffa20;
  group *in_stack_fffffffffffffa28;
  parameter *in_stack_fffffffffffffaa0;
  parameter *in_stack_fffffffffffffaa8;
  undefined1 local_389;
  undefined1 local_388 [295];
  allocator local_261;
  undefined1 local_260 [295];
  allocator local_139;
  string local_138 [312];
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  clipp::group::group(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  clipp::option<char_const(&)[3],char_const(&)[10]>
            (in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"shows version information",&local_139);
  clipp::detail::operator%
            (&in_stack_fffffffffffff830->super_token<clipp::parameter>,
             (doc_string *)in_stack_fffffffffffff828);
  clipp::parameter::parameter(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  clipp::parameter::~parameter(in_stack_fffffffffffff830);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (in_stack_fffffffffffff988,(char (*) [7])in_stack_fffffffffffff980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_260,"shows this help message",&local_261);
  this_03 = (parameter *)(local_260 + 0x20);
  this_02 = (parameter *)local_260;
  clipp::detail::operator%
            (&in_stack_fffffffffffff830->super_token<clipp::parameter>,
             (doc_string *)in_stack_fffffffffffff828);
  clipp::parameter::parameter(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  std::__cxx11::string::~string((string *)this_02);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  clipp::parameter::~parameter(in_stack_fffffffffffff830);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (in_stack_fffffffffffff988,(char (*) [7])in_stack_fffffffffffff980);
  this_01 = (group *)&local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_388,"outputs the current session info",(allocator *)this_01);
  this_00 = (parameter *)(local_388 + 0x20);
  docstr = (parameter *)local_388;
  clipp::detail::operator%((token<clipp::parameter> *)this_00,(doc_string *)docstr);
  clipp::parameter::parameter(this_00,docstr);
  std::__cxx11::string::~string((string *)docstr);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  clipp::parameter::~parameter(this_00);
  pgVar1 = (group *)(in_RDI + 0x368);
  clipp::parameter::parameter(this_03,this_02);
  clipp::parameter::parameter(this_03,this_02);
  clipp::operator|(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  clipp::parameter::parameter(this_03,this_02);
  clipp::operator|(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  clipp::group::group(this_01,pgVar1);
  clipp::operator|(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  clipp::group::~group((group *)this_00);
  clipp::group::~group((group *)this_00);
  clipp::parameter::~parameter(this_00);
  clipp::group::~group((group *)this_00);
  clipp::parameter::~parameter(this_00);
  clipp::parameter::~parameter(this_00);
  return;
}

Assistant:

WrappedArgsParser(const std::string& pname, const group& sel) noexcept
      : program_name(pname), selection_options(sel) {}